

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatOrderH.c
# Opt level: O2

int Msat_OrderVarSelect(Msat_Order_t *p)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  double *pdVar5;
  uint uVar6;
  int iVar7;
  abctime aVar8;
  abctime aVar9;
  Msat_IntVec_t *p_00;
  uint uVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  double dVar15;
  double dVar16;
  
  aVar8 = Abc_Clock();
  p_00 = p->vHeap;
  do {
    if (p_00->nSize == 1) {
      return -3;
    }
    iVar1 = p_00->pArray[1];
    iVar7 = Msat_IntVecPop(p_00);
    p_00 = p->vHeap;
    piVar3 = p_00->pArray;
    piVar3[1] = iVar7;
    piVar4 = p->vIndex->pArray;
    piVar4[iVar7] = 1;
    piVar4[iVar1] = 0;
    iVar7 = p_00->nSize;
    if (1 < iVar7) {
      iVar2 = piVar3[1];
      uVar10 = 1;
      while( true ) {
        uVar6 = uVar10 * 2;
        if (iVar7 <= (int)uVar6) break;
        uVar11 = uVar6 | 1;
        pdVar5 = p->pSat->pdActivity;
        if ((int)uVar11 < iVar7) {
          iVar14 = piVar3[(int)uVar11];
          lVar12 = (long)piVar3[(int)uVar6];
          dVar15 = pdVar5[lVar12];
          lVar13 = (long)iVar14;
          dVar16 = pdVar5[iVar14];
          iVar7 = piVar3[(int)uVar6];
          if (pdVar5[iVar14] <= dVar15) goto LAB_00754e01;
        }
        else {
          lVar12 = (long)piVar3[(int)uVar6];
          dVar15 = pdVar5[lVar12];
          iVar7 = piVar3[(int)uVar6];
LAB_00754e01:
          iVar14 = iVar7;
          lVar13 = lVar12;
          dVar16 = dVar15;
          uVar11 = uVar6;
        }
        if (dVar16 < pdVar5[iVar2] || dVar16 == pdVar5[iVar2]) break;
        piVar3[(int)uVar10] = iVar14;
        piVar4[lVar13] = uVar10;
        iVar7 = p_00->nSize;
        uVar10 = uVar11;
      }
      piVar3[(int)uVar10] = iVar2;
      piVar4[iVar2] = uVar10;
    }
    if (p->pSat->pAssigns[iVar1] == -1) {
      aVar9 = Abc_Clock();
      timeSelect = timeSelect + (aVar9 - aVar8);
      return iVar1;
    }
  } while( true );
}

Assistant:

int Msat_OrderVarSelect( Msat_Order_t * p )
{
    // Activity based decision:
//    while (!heap.empty()){
//        Var next = heap.getmin();
//        if (toLbool(assigns[next]) == l_Undef)
//            return next;
//    }
//    return var_Undef;

    int Var;
    abctime clk = Abc_Clock();

    while ( !HEMPTY(p) )
    {
        Var = Msat_HeapGetTop(p);
        if ( (p)->pSat->pAssigns[Var] == MSAT_VAR_UNASSIGNED )
        {
//assert( Msat_OrderCheck(p) );
timeSelect += Abc_Clock() - clk;
            return Var;
        }
    }
    return MSAT_ORDER_UNKNOWN;
}